

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinTree.h
# Opt level: O2

BinSTree<int> * __thiscall BinTrees::BinSTree<int>::search(BinSTree<int> *this,int *v)

{
  int iVar1;
  runtime_error *this_00;
  
  do {
    while (iVar1 = ((BinTree<int> *)&(this->super_BinTree<int>).v)->v, *v < iVar1) {
      this = (BinSTree<int> *)(this->super_BinTree<int>).l;
      if ((BinTree<int> *)this == (BinTree<int> *)0x0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Not found");
        goto LAB_00101a5d;
      }
    }
    if (iVar1 == *v) {
      return (BinSTree<int> *)&this->super_BinTree<int>;
    }
    this = (BinSTree<int> *)(this->super_BinTree<int>).r;
  } while ((BinTree<int> *)this != (BinTree<int> *)0x0);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Not found");
LAB_00101a5d:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const BinSTree<T> &BinSTree<T>::search(const T &v) const {
        if (this->v > v) {
            if (this->L() == nullptr) throw std::runtime_error("Not found");
            return static_cast<BinSTree<T> *>(this->L())->search(v);
        } else if (this->v == v) return *this;
        else {
            if (this->R() == nullptr) throw std::runtime_error("Not found");
            return static_cast<BinSTree<T> *>(this->R())->search(v);
        }
    }